

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chacha.c
# Opt level: O3

int chacha_test_multiblock_incremental(chacha_key *key,chacha_iv *iv,uint8_t *in,uint8_t *out)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  uint8_t *puVar8;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  uint8_t *in_00;
  ulong uVar14;
  ulong uVar15;
  bool bVar16;
  uint8_t final [64];
  uint local_f8 [16];
  chacha_state local_b8;
  
  iVar5 = 1;
  lVar11 = -1;
  uVar15 = 1;
  do {
    memset(out,0,0x800);
    local_b8.opaque._0_8_ = *(undefined8 *)key->b;
    local_b8.opaque._8_8_ = *(undefined8 *)(key->b + 8);
    local_b8.opaque._16_8_ = *(undefined8 *)(key->b + 0x10);
    local_b8.opaque._24_8_ = *(undefined8 *)(key->b + 0x18);
    local_b8.opaque[0x20] = 0xff;
    local_b8.opaque[0x21] = 0xff;
    local_b8.opaque[0x22] = 0xff;
    local_b8.opaque[0x23] = 0xff;
    local_b8.opaque[0x24] = '\0';
    local_b8.opaque[0x25] = '\0';
    local_b8.opaque[0x26] = '\0';
    local_b8.opaque[0x27] = '\0';
    local_b8.opaque._40_8_ = *(undefined8 *)iv->b;
    local_b8.opaque[0x30] = '\b';
    local_b8.opaque[0x31] = '\0';
    local_b8.opaque[0x32] = '\0';
    local_b8.opaque[0x33] = '\0';
    local_b8.opaque[0x34] = '\0';
    local_b8.opaque[0x35] = '\0';
    local_b8.opaque[0x36] = '\0';
    local_b8.opaque[0x37] = '\0';
    local_b8.opaque[0x38] = '\0';
    local_b8.opaque[0x39] = '\0';
    local_b8.opaque[0x3a] = '\0';
    local_b8.opaque[0x3b] = '\0';
    local_b8.opaque[0x3c] = '\0';
    local_b8.opaque[0x3d] = '\0';
    local_b8.opaque[0x3e] = '\0';
    local_b8.opaque[0x3f] = '\0';
    lVar13 = 0;
    uVar14 = 0;
    puVar8 = out;
    uVar12 = uVar15;
    do {
      uVar9 = 0x800;
      if (uVar12 < 0x800) {
        uVar9 = uVar12;
      }
      in_00 = in + uVar14;
      if (in == (uint8_t *)0x0) {
        in_00 = (uint8_t *)0x0;
      }
      uVar14 = uVar14 + uVar15;
      sVar7 = chacha_update(&local_b8,in_00,puVar8,uVar9 + lVar13);
      puVar8 = puVar8 + sVar7;
      uVar12 = uVar12 + uVar15;
      lVar13 = lVar13 + lVar11;
    } while (uVar14 < 0x801);
    chacha_final(&local_b8,puVar8);
    local_f8[0] = 0;
    local_f8[1] = 0;
    local_f8[2] = 0;
    local_f8[3] = 0;
    local_f8[4] = 0;
    local_f8[5] = 0;
    local_f8[6] = 0;
    local_f8[7] = 0;
    local_f8[8] = 0;
    local_f8[9] = 0;
    local_f8[10] = 0;
    local_f8[0xb] = 0;
    local_f8[0xc] = 0;
    local_f8[0xd] = 0;
    local_f8[0xe] = 0;
    local_f8[0xf] = 0;
    lVar13 = 0;
    puVar8 = out;
    do {
      lVar10 = 0;
      do {
        puVar1 = (uint *)(puVar8 + lVar10);
        uVar2 = puVar1[1];
        uVar3 = puVar1[2];
        uVar4 = puVar1[3];
        *(uint *)((long)local_f8 + lVar10) = *puVar1 ^ *(uint *)((long)local_f8 + lVar10);
        *(uint *)((long)local_f8 + lVar10 + 4) = uVar2 ^ *(uint *)((long)local_f8 + lVar10 + 4);
        *(uint *)((long)local_f8 + lVar10 + 8) = uVar3 ^ *(uint *)((long)local_f8 + lVar10 + 8);
        *(uint *)((long)local_f8 + lVar10 + 0xc) = uVar4 ^ *(uint *)((long)local_f8 + lVar10 + 0xc);
        lVar10 = lVar10 + 0x10;
      } while (lVar10 != 0x40);
      lVar13 = lVar13 + 1;
      puVar8 = puVar8 + 0x40;
    } while (lVar13 != 0x20);
    iVar6 = bcmp(expected_chacha,local_f8,0x40);
    if (iVar6 != 0) {
      iVar5 = 0;
    }
    lVar11 = lVar11 + -0x3d;
    bVar16 = uVar15 < 0x7c3;
    uVar15 = uVar15 + 0x3d;
  } while (bVar16);
  return iVar5;
}

Assistant:

static int
chacha_test_multiblock_incremental(chacha_key *key, chacha_iv *iv, const uint8_t *in, uint8_t *out) {
    chacha_state st;
    uint8_t final[CHACHA_BLOCKBYTES];
    size_t i, inc;
    uint8_t *p;
    int res = 1;

    for (inc = 1; inc < CHACHA_TEST_LEN; inc += 61) {
        p = out;
        memset(out, 0, CHACHA_TEST_LEN);
        chacha_test_init_state(&st, key, iv);
        for(i = 0; i <= CHACHA_TEST_LEN; i += inc)
            p += chacha_update(&st, (in) ? (in + i) : NULL, p, ((i + inc) > CHACHA_TEST_LEN) ? (CHACHA_TEST_LEN - i) : inc);
        chacha_final(&st, p);
        chacha_test_compact_array(final, out, CHACHA_TEST_LEN);
        res &= (memcmp(expected_chacha, final, sizeof(expected_chacha)) == 0) ? 1 : 0;
    }

    return res;
}